

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimations(OgreBinarySerializer *this,Mesh *mesh)

{
  pointer *pppAVar1;
  StreamReader<false,_false> *pSVar2;
  iterator __position;
  unsigned_short uVar3;
  uint uVar4;
  Animation *this_00;
  MemoryStreamReader *this_01;
  bool bVar5;
  float fVar6;
  Animation *anim;
  Animation *local_60;
  vector<Assimp::Ogre::Animation*,std::allocator<Assimp::Ogre::Animation*>> *local_58;
  string local_50;
  
  pSVar2 = this->m_reader;
  if (*(int *)&pSVar2->end != *(int *)&pSVar2->current) {
    uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar2);
    uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar4;
    this_01 = this->m_reader;
    bVar5 = *(int *)&this_01->end == *(int *)&this_01->current;
    if (uVar3 == 0xd100 && !bVar5) {
      local_58 = (vector<Assimp::Ogre::Animation*,std::allocator<Assimp::Ogre::Animation*>> *)
                 &mesh->animations;
      do {
        this_00 = (Animation *)operator_new(0x70);
        Animation::Animation(this_00,mesh);
        local_60 = this_00;
        ReadLine_abi_cxx11_(&local_50,this);
        std::__cxx11::string::operator=((string *)&local_60->name,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        fVar6 = StreamReader<false,_false>::Get<float>(this->m_reader);
        local_60->length = fVar6;
        ReadAnimation(this,local_60);
        __position._M_current =
             (mesh->animations).
             super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (mesh->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Ogre::Animation*,std::allocator<Assimp::Ogre::Animation*>>::
          _M_realloc_insert<Assimp::Ogre::Animation*const&>(local_58,__position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          pppAVar1 = &(mesh->animations).
                      super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        pSVar2 = this->m_reader;
        if (*(int *)&pSVar2->end != *(int *)&pSVar2->current) {
          uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar2);
          uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar4;
        }
        this_01 = this->m_reader;
        bVar5 = *(int *)&this_01->end == *(int *)&this_01->current;
      } while ((!bVar5) && (uVar3 == 0xd100));
    }
    if (!bVar5) {
      StreamReader<false,_false>::IncPtr(this_01,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimations(Mesh *mesh)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_ANIMATION)
        {
            Animation *anim = new Animation(mesh);
            anim->name = ReadLine();
            anim->length = Read<float>();

            ReadAnimation(anim);

            mesh->animations.push_back(anim);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}